

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O1

StructuralComponent * __thiscall
ASDCP::MXF::StructuralComponent::WriteToTLVSet(StructuralComponent *this,TLVWriter *TLVSet)

{
  MDDEntry *pMVar1;
  MDDEntry *in_RDX;
  TLVWriter local_80;
  
  if (TLVSet[1].super_MemIOWriter.m_p != (byte_t *)0x0) {
    InterchangeObject::WriteToTLVSet(&this->super_InterchangeObject,TLVSet);
    if (-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                MDD_StructuralComponent_DataDefinition);
      TLVWriter::WriteObject(&local_80,in_RDX,(IArchive *)pMVar1);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
    }
    if ((-1 < *(int *)&(this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket) &&
       ((char)TLVSet[2].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_node_count == '\x01')) {
      pMVar1 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                                MDD_StructuralComponent_Duration);
      TLVWriter::WriteUi64(&local_80,in_RDX,(ui64_t *)pMVar1);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
    }
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x3dd,
                "virtual ASDCP::Result_t ASDCP::MXF::StructuralComponent::WriteToTLVSet(TLVWriter &)"
               );
}

Assistant:

ASDCP::Result_t
StructuralComponent::WriteToTLVSet(TLVWriter& TLVSet)
{
  assert(m_Dict);
  Result_t result = InterchangeObject::WriteToTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(StructuralComponent, DataDefinition));
  if ( ASDCP_SUCCESS(result)  && ! Duration.empty() ) result = TLVSet.WriteUi64(OBJ_WRITE_ARGS_OPT(StructuralComponent, Duration));
  return result;
}